

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_data.cpp
# Opt level: O1

void __thiscall duckdb::ClientData::~ClientData(ClientData *this)

{
  pointer pcVar1;
  _Head_base<0UL,_duckdb::FileSystem_*,_false> _Var2;
  _Head_base<0UL,_duckdb::FileOpener_*,_false> _Var3;
  _Head_base<0UL,_duckdb::CatalogSearchPath_*,_false> _Var4;
  _Head_base<0UL,_duckdb::BufferedFileWriter_*,_false> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  
  pcVar1 = (this->file_search_path)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->file_search_path).field_2) {
    operator_delete(pcVar1);
  }
  _Var2._M_head_impl =
       (this->client_file_system).
       super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
       super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
       super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (FileSystem *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_FileSystem[1])();
  }
  (this->client_file_system).
  super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
  super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
  super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl = (FileSystem *)0x0;
  _Var3._M_head_impl =
       (this->file_opener).
       super_unique_ptr<duckdb::FileOpener,_std::default_delete<duckdb::FileOpener>_>._M_t.
       super___uniq_ptr_impl<duckdb::FileOpener,_std::default_delete<duckdb::FileOpener>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FileOpener_*,_std::default_delete<duckdb::FileOpener>_>.
       super__Head_base<0UL,_duckdb::FileOpener_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (FileOpener *)0x0) {
    (*(_Var3._M_head_impl)->_vptr_FileOpener[1])();
  }
  (this->file_opener).super_unique_ptr<duckdb::FileOpener,_std::default_delete<duckdb::FileOpener>_>
  ._M_t.super___uniq_ptr_impl<duckdb::FileOpener,_std::default_delete<duckdb::FileOpener>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileOpener_*,_std::default_delete<duckdb::FileOpener>_>.
  super__Head_base<0UL,_duckdb::FileOpener_*,_false>._M_head_impl = (FileOpener *)0x0;
  _Var4._M_head_impl =
       (this->catalog_search_path).
       super_unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CatalogSearchPath_*,_std::default_delete<duckdb::CatalogSearchPath>_>
       .super__Head_base<0UL,_duckdb::CatalogSearchPath_*,_false>._M_head_impl;
  if (_Var4._M_head_impl != (CatalogSearchPath *)0x0) {
    ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::~vector
              (&((_Var4._M_head_impl)->set_paths).
                super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
              );
    ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::~vector
              (&((_Var4._M_head_impl)->paths).
                super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
              );
    operator_delete(_Var4._M_head_impl);
  }
  (this->catalog_search_path).
  super_unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>_>._M_t.
  super___uniq_ptr_impl<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::CatalogSearchPath_*,_std::default_delete<duckdb::CatalogSearchPath>_>
  .super__Head_base<0UL,_duckdb::CatalogSearchPath_*,_false>._M_head_impl = (CatalogSearchPath *)0x0
  ;
  ::std::unique_ptr<duckdb::RandomEngine,_std::default_delete<duckdb::RandomEngine>_>::~unique_ptr
            (&(this->random_engine).
              super_unique_ptr<duckdb::RandomEngine,_std::default_delete<duckdb::RandomEngine>_>);
  _Var5._M_head_impl =
       (this->log_query_writer).
       super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
       .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl;
  if (_Var5._M_head_impl != (BufferedFileWriter *)0x0) {
    (**(code **)(*(long *)&(_Var5._M_head_impl)->super_WriteStream + 0x10))();
  }
  (this->log_query_writer).
  super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
  .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl =
       (BufferedFileWriter *)0x0;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->prepared_statements)._M_h);
  p_Var6 = (this->temporary_objects).internal.
           super___shared_ptr<duckdb::AttachedDatabase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  p_Var6 = (this->http_logger).internal.
           super___shared_ptr<duckdb::HTTPLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  p_Var6 = (this->profiler).internal.
           super___shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
    return;
  }
  return;
}

Assistant:

ClientData::~ClientData() {
}